

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrSat.c
# Opt level: O1

Vec_Int_t * Pdr_ManLitsToCube(Pdr_Man_t *p,int k,int *pArray,int nArray)

{
  int iVar1;
  ulong uVar2;
  
  p->vLits->nSize = 0;
  if (0 < nArray) {
    uVar2 = 0;
    do {
      iVar1 = Pdr_ObjRegNum(p,k,pArray[uVar2] >> 1);
      if (iVar1 != -1) {
        if ((iVar1 < 0) || (p->pAig->nRegs <= iVar1)) {
          __assert_fail("RegId >= 0 && RegId < Aig_ManRegNum(p->pAig)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrSat.c"
                        ,0x7c,"Vec_Int_t *Pdr_ManLitsToCube(Pdr_Man_t *, int, int *, int)");
        }
        Vec_IntPush(p->vLits,(pArray[uVar2] & 1U) + iVar1 * 2 ^ 1);
      }
      uVar2 = uVar2 + 1;
    } while ((uint)nArray != uVar2);
  }
  iVar1 = p->vLits->nSize;
  if ((-1 < iVar1) && (iVar1 <= nArray)) {
    return p->vLits;
  }
  __assert_fail("Vec_IntSize(p->vLits) >= 0 && Vec_IntSize(p->vLits) <= nArray",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrSat.c"
                ,0x7f,"Vec_Int_t *Pdr_ManLitsToCube(Pdr_Man_t *, int, int *, int)");
}

Assistant:

Vec_Int_t * Pdr_ManLitsToCube( Pdr_Man_t * p, int k, int * pArray, int nArray )
{
    int i, RegId;
    Vec_IntClear( p->vLits );
    for ( i = 0; i < nArray; i++ )
    {
        RegId = Pdr_ObjRegNum( p, k, lit_var(pArray[i]) );
        if ( RegId == -1 )
            continue;
        assert( RegId >= 0 && RegId < Aig_ManRegNum(p->pAig) );
        Vec_IntPush( p->vLits, toLitCond(RegId, !lit_sign(pArray[i])) );
    }
    assert( Vec_IntSize(p->vLits) >= 0 && Vec_IntSize(p->vLits) <= nArray );
    return p->vLits;
}